

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseJacocoCoverage.cxx
# Opt level: O2

bool __thiscall
cmParseJacocoCoverage::XMLParser::PackagePathFound(XMLParser *this,string *fileName,string *baseDir)

{
  pointer pbVar1;
  cmCTest *this_00;
  bool bVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  ostream *poVar4;
  pointer fileOrDir;
  string_view suffix;
  string_view str;
  string dir;
  char *local_238 [4];
  string packageGlob;
  Glob gl;
  ostringstream cmCTestLog_msg;
  
  cmCTestLog_msg = (ostringstream)0x2f;
  cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&>
            (&packageGlob,baseDir,(char *)&cmCTestLog_msg,fileName);
  cmsys::Glob::Glob(&gl);
  gl.Recurse = true;
  gl.RecurseThroughSymlinks = true;
  cmsys::Glob::FindFiles(&gl,&packageGlob,(GlobMessages *)0x0);
  pvVar3 = cmsys::Glob::GetFiles_abi_cxx11_(&gl);
  fileOrDir = (pvVar3->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (pvVar3->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (fileOrDir != pbVar1) {
    for (; fileOrDir != pbVar1; fileOrDir = fileOrDir + 1) {
      cmsys::SystemTools::GetParentDirectory(&dir,fileOrDir);
      suffix._M_str = (this->PackageName)._M_dataplus._M_p;
      suffix._M_len = (this->PackageName)._M_string_length;
      str._M_str = dir._M_dataplus._M_p;
      str._M_len = dir._M_string_length;
      bVar2 = cmHasSuffix(str,suffix);
      if (bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,"Found package directory for ");
        poVar4 = std::operator<<(poVar4,(string *)fileName);
        poVar4 = std::operator<<(poVar4,": ");
        poVar4 = std::operator<<(poVar4,(string *)&dir);
        std::endl<char,std::char_traits<char>>(poVar4);
        this_00 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(this_00,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmParseJacocoCoverage.cxx"
                     ,0x7d,local_238[0],this->Coverage->Quiet);
        std::__cxx11::string::~string((string *)local_238);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        std::__cxx11::string::_M_assign((string *)&this->PackagePath);
        std::__cxx11::string::~string((string *)&dir);
        bVar2 = true;
        goto LAB_001d10e3;
      }
      std::__cxx11::string::~string((string *)&dir);
    }
  }
  bVar2 = false;
LAB_001d10e3:
  cmsys::Glob::~Glob(&gl);
  std::__cxx11::string::~string((string *)&packageGlob);
  return bVar2;
}

Assistant:

virtual bool PackagePathFound(std::string const& fileName,
                                std::string const& baseDir)
  {
    // Search for the file in the baseDir and its subdirectories.
    std::string packageGlob = cmStrCat(baseDir, '/', fileName);
    cmsys::Glob gl;
    gl.RecurseOn();
    gl.RecurseThroughSymlinksOn();
    gl.FindFiles(packageGlob);
    std::vector<std::string> const& files = gl.GetFiles();
    if (files.empty()) {
      return false;
    }

    // Check if any of the locations found match our package.
    for (std::string const& f : files) {
      std::string dir = cmsys::SystemTools::GetParentDirectory(f);
      if (cmHasSuffix(dir, this->PackageName)) {
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "Found package directory for " << fileName << ": "
                                                          << dir << std::endl,
                           this->Coverage.Quiet);
        this->PackagePath = dir;
        return true;
      }
    }
    return false;
  }